

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall
pbrt::PixelStatsAccumulator::ReportRatio
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t num,int64_t denom
          )

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  WrapMode2D wrapMode_03;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i p_03;
  Point2i p_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  size_type sVar2;
  reference this_00;
  char *in_RCX;
  int in_EDX;
  long *in_RDI;
  Float FVar3;
  Point2i pp;
  Point2i res;
  Image *im;
  Image *in_stack_fffffffffffffc88;
  Image *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  WrapMode in_stack_fffffffffffffc9c;
  WrapMode2D *in_stack_fffffffffffffca0;
  reference this_01;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> *in_stack_fffffffffffffcb0;
  allocator<char> *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffd00;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  Tuple2<pbrt::Point2,_int> p_05;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined1 *puVar4;
  int in_stack_fffffffffffffd20;
  ColorEncodingHandle *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  PixelFormat format;
  Image *in_stack_fffffffffffffdb0;
  Allocator in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffdd0;
  Image *local_220;
  allocator<char> local_20e;
  allocator<char> local_20d [20];
  allocator<char> local_1f9;
  undefined1 *local_1f8;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [32];
  undefined1 *local_190;
  undefined8 local_188;
  Tuple2<pbrt::Point2,_int> local_170;
  Tuple2<pbrt::Point2,_int> local_50;
  Tuple2<pbrt::Vector2,_int> local_48;
  Tuple2<pbrt::Point2,_int> local_40;
  reference local_38;
  char *local_20;
  int local_14;
  
  format = (PixelFormat)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_20 = in_RCX;
  local_14 = in_EDX;
  sVar2 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                    ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x160));
  if (sVar2 <= (ulong)(long)in_EDX) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (in_stack_fffffffffffffcb0,
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffcb0,
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(*in_RDI + 0x148),(long)local_14);
    std::__cxx11::string::operator=((string *)this_00,local_20);
  }
  local_38 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                       ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x160),
                        (long)local_14);
  local_48 = (Tuple2<pbrt::Vector2,_int>)
             Bounds2<int>::Diagonal((Bounds2<int> *)in_stack_fffffffffffffc88);
  Point2<int>::Point2<int>
            ((Point2<int> *)in_stack_fffffffffffffc90,(Vector2<int> *)in_stack_fffffffffffffc88);
  local_50 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_38);
  bVar1 = Tuple2<pbrt::Point2,_int>::operator!=(&local_50,(Point2<int> *)&local_40);
  puVar4 = (undefined1 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18);
  p_05.y = in_stack_fffffffffffffd14;
  p_05.x = in_stack_fffffffffffffd10;
  if (bVar1) {
    local_170 = local_40;
    local_1f8 = local_1f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    local_1f8 = local_1d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    local_1f8 = local_1b0;
    in_stack_fffffffffffffd20 = (int)&local_20e;
    puVar4 = local_1f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    local_190 = local_1f0;
    local_188 = 3;
    v._M_array._4_4_ = in_stack_fffffffffffffc9c;
    v._M_array._0_4_ = in_stack_fffffffffffffc98;
    v._M_len = (size_type)in_stack_fffffffffffffca0;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffc90,v);
    ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffc90);
    channels.n = in_stack_fffffffffffffdc8;
    channels.ptr = in_stack_fffffffffffffdc0;
    Image::Image(in_stack_fffffffffffffdb0,format,(Point2i)in_stack_fffffffffffffdd0,channels,
                 in_stack_fffffffffffffda0,in_stack_fffffffffffffdb8);
    Image::operator=(in_stack_fffffffffffffc90,local_220);
    Image::~Image(in_stack_fffffffffffffc90);
    in_stack_fffffffffffffd08 = (Tuple2<pbrt::Point2,_int>)local_1f0;
    in_stack_fffffffffffffd00 = (Tuple2<pbrt::Point2,_int>)&local_190;
    in_stack_fffffffffffffc88 = local_220;
    do {
      in_stack_fffffffffffffd00 =
           (Tuple2<pbrt::Point2,_int>)((long)in_stack_fffffffffffffd00 + -0x20);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffd00);
    } while (in_stack_fffffffffffffd00 != in_stack_fffffffffffffd08);
    p_05 = in_stack_fffffffffffffd00;
    std::allocator<char>::~allocator(&local_20e);
    std::allocator<char>::~allocator(local_20d);
    std::allocator<char>::~allocator(&local_1f9);
  }
  Point2<int>::operator-((Point2<int> *)in_stack_fffffffffffffc88,(Point2<int> *)0x907ded);
  Point2<int>::Point2<int>
            ((Point2<int> *)in_stack_fffffffffffffc90,(Vector2<int> *)in_stack_fffffffffffffc88);
  WrapMode2D::WrapMode2D(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffd20;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar4 >> 0x20);
  wrapMode.wrap.values[1] = (WrapMode)puVar4;
  wrapMode.wrap.values[0] = p_05.y;
  Image::GetChannel((Image *)in_stack_fffffffffffffd08,p_00,in_stack_fffffffffffffd00.y,wrapMode);
  Image::SetChannel((Image *)in_stack_fffffffffffffd08,(Point2i)p_05,in_stack_fffffffffffffd00.y,
                    (Float)in_stack_fffffffffffffd00.x);
  WrapMode2D::WrapMode2D(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffd20;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar4 >> 0x20);
  wrapMode_00.wrap.values[1] = (WrapMode)puVar4;
  wrapMode_00.wrap.values[0] = p_05.y;
  Image::GetChannel((Image *)in_stack_fffffffffffffd08,p_01,in_stack_fffffffffffffd00.y,wrapMode_00)
  ;
  Image::SetChannel((Image *)in_stack_fffffffffffffd08,(Point2i)p_05,in_stack_fffffffffffffd00.y,
                    (Float)in_stack_fffffffffffffd00.x);
  WrapMode2D::WrapMode2D(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffd20;
  p_02.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar4 >> 0x20);
  wrapMode_01.wrap.values[1] = (WrapMode)puVar4;
  wrapMode_01.wrap.values[0] = p_05.y;
  FVar3 = Image::GetChannel((Image *)in_stack_fffffffffffffd08,p_02,in_stack_fffffffffffffd00.y,
                            wrapMode_01);
  if ((FVar3 != 0.0) || (NAN(FVar3))) {
    this_01 = local_38;
    WrapMode2D::WrapMode2D((WrapMode2D *)local_38,in_stack_fffffffffffffc9c);
    p_03.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffd20;
    p_03.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar4 >> 0x20);
    wrapMode_02.wrap.values[1] = (WrapMode)puVar4;
    wrapMode_02.wrap.values[0] = p_05.y;
    Image::GetChannel((Image *)in_stack_fffffffffffffd08,p_03,in_stack_fffffffffffffd00.y,
                      wrapMode_02);
    WrapMode2D::WrapMode2D((WrapMode2D *)this_01,(WrapMode)((ulong)local_38 >> 0x20));
    p_04.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffd20;
    p_04.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar4 >> 0x20);
    wrapMode_03.wrap.values[1] = (WrapMode)puVar4;
    wrapMode_03.wrap.values[0] = p_05.y;
    Image::GetChannel((Image *)in_stack_fffffffffffffd08,p_04,in_stack_fffffffffffffd00.y,
                      wrapMode_03);
    Image::SetChannel((Image *)in_stack_fffffffffffffd08,(Point2i)p_05,in_stack_fffffffffffffd00.y,
                      (Float)in_stack_fffffffffffffd00.x);
  }
  else {
    Image::SetChannel((Image *)in_stack_fffffffffffffd08,(Point2i)p_05,in_stack_fffffffffffffd00.y,
                      (Float)in_stack_fffffffffffffd00.x);
  }
  return;
}

Assistant:

void PixelStatsAccumulator::ReportRatio(const Point2i &p, int statIndex, const char *name,
                                        int64_t num, int64_t denom) {
    if (statIndex >= stats->ratioImages.size()) {
        stats->ratioImages.resize(statIndex + 1);
        stats->ratioNames.resize(statIndex + 1);
        stats->ratioNames[statIndex] = name;
    }

    Image &im = stats->ratioImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"numerator", "denominator", "ratio"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + num);
    im.SetChannel(pp, 1, im.GetChannel(pp, 1) + denom);
    if (im.GetChannel(pp, 0) == 0)
        im.SetChannel(pp, 2, 0);
    else
        im.SetChannel(pp, 2, im.GetChannel(pp, 0) / im.GetChannel(pp, 1));
}